

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeFunctionSet * __thiscall
ExpressionContext::GetFunctionSetType(ExpressionContext *this,ArrayView<TypeBase_*> setTypes)

{
  SmallArray<TypeFunctionSet_*,_128U> *this_00;
  TypeFunctionSet *pTVar1;
  IntrusiveList<TypeHandle> types;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  long lVar8;
  TypeFunctionSet *unaff_R15;
  bool bVar9;
  InplaceStr IVar10;
  IntrusiveList<TypeHandle> setTypeList;
  IntrusiveList<TypeHandle> local_58;
  TypeHandle *local_48;
  TypeHandle *pTStack_40;
  TypeHandle *pTVar4;
  
  this_00 = &this->functionSetTypes;
  uVar5 = (ulong)(this->functionSetTypes).count;
  bVar9 = uVar5 != 0;
  uVar3 = setTypes.count;
  if (bVar9) {
    uVar6 = 0;
    do {
      pTVar1 = this_00->data[uVar6];
      if (pTVar1 == (TypeFunctionSet *)0x0) {
        bVar7 = 0;
      }
      else {
        pTVar4 = (pTVar1->types).head;
        if (uVar3 != 0) {
          lVar8 = 0;
          do {
            bVar7 = 0;
            if ((pTVar4 == (TypeHandle *)0x0) || (pTVar4->type != setTypes.data[lVar8]))
            goto LAB_0014c2f3;
            pTVar4 = pTVar4->next;
            lVar8 = lVar8 + 1;
          } while (uVar3 != (uint)lVar8);
        }
        bVar7 = (pTVar4 != (TypeHandle *)0x0) * '\x03' + 1;
        if (pTVar4 == (TypeHandle *)0x0) {
          unaff_R15 = pTVar1;
        }
      }
LAB_0014c2f3:
      if ((bVar7 & 3) != 0) break;
      uVar6 = uVar6 + 1;
      bVar9 = uVar6 < uVar5;
    } while (uVar6 != uVar5);
  }
  if (!bVar9) {
    local_58.head = (TypeHandle *)0x0;
    local_58.tail = (TypeHandle *)0x0;
    if (uVar3 != 0) {
      uVar5 = 0;
      do {
        iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x18);
        pTVar4 = (TypeHandle *)CONCAT44(extraout_var,iVar2);
        pTVar4->type = setTypes.data[uVar5];
        pTVar4->next = (TypeHandle *)0x0;
        pTVar4->listed = false;
        IntrusiveList<TypeHandle>::push_back(&local_58,pTVar4);
        uVar5 = uVar5 + 1;
      } while ((setTypes._8_8_ & 0xffffffff) != uVar5);
    }
    iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x70);
    unaff_R15 = (TypeFunctionSet *)CONCAT44(extraout_var_00,iVar2);
    types.tail = local_58.tail;
    types.head = local_58.head;
    IVar10 = GetFunctionSetTypeName(this,types);
    local_48 = local_58.head;
    pTStack_40 = local_58.tail;
    (unaff_R15->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00229780;
    (unaff_R15->super_TypeBase).typeID = 0x1a;
    (unaff_R15->super_TypeBase).name = IVar10;
    (unaff_R15->super_TypeBase).arrayTypes.head = (TypeHandle *)0x0;
    (unaff_R15->super_TypeBase).arrayTypes.tail = (TypeHandle *)0x0;
    uVar3 = NULLC::GetStringHash(IVar10.begin,IVar10.end);
    (unaff_R15->super_TypeBase).nameHash = uVar3;
    (unaff_R15->super_TypeBase).importModule = (ModuleData *)0x0;
    (unaff_R15->super_TypeBase).typeIndex = 0xffffffff;
    (unaff_R15->super_TypeBase).refType = (TypeRef *)0x0;
    (unaff_R15->super_TypeBase).unsizedArrayType = (TypeUnsizedArray *)0x0;
    *(undefined8 *)&(unaff_R15->super_TypeBase).alignment = 0;
    *(undefined8 *)((long)&(unaff_R15->super_TypeBase).size + 4) = 0;
    *(undefined4 *)((long)&(unaff_R15->super_TypeBase).padding + 3) = 0;
    (unaff_R15->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00229898;
    (unaff_R15->types).head = local_48;
    (unaff_R15->types).tail = pTStack_40;
    (unaff_R15->super_TypeBase).isGeneric = true;
    uVar3 = (this->functionSetTypes).count;
    if (uVar3 == (this->functionSetTypes).max) {
      SmallArray<TypeFunctionSet_*,_128U>::grow(this_00,uVar3);
    }
    if (this_00->data == (TypeFunctionSet **)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<TypeFunctionSet *, 128>::push_back(const T &) [T = TypeFunctionSet *, N = 128]"
                   );
    }
    uVar3 = (this->functionSetTypes).count;
    (this->functionSetTypes).count = uVar3 + 1;
    this_00->data[uVar3] = unaff_R15;
  }
  return unaff_R15;
}

Assistant:

TypeFunctionSet* ExpressionContext::GetFunctionSetType(ArrayView<TypeBase*> setTypes)
{
	for(unsigned i = 0, e = functionSetTypes.count; i < e; i++)
	{
		if(TypeFunctionSet *type = functionSetTypes.data[i])
		{
			TypeHandle *leftArg = type->types.head;

			bool match = true;

			for(unsigned i = 0; i < setTypes.size(); i++)
			{
				if(!leftArg || leftArg->type != setTypes[i])
				{
					match = false;
					break;
				}

				leftArg = leftArg->next;
			}

			if(!match)
				continue;

			if(leftArg)
				continue;

			return type;
		}
	}

	IntrusiveList<TypeHandle> setTypeList;

	for(unsigned i = 0; i < setTypes.size(); i++)
		setTypeList.push_back(new (get<TypeHandle>()) TypeHandle(setTypes[i]));

	// Create new type
	TypeFunctionSet* result = new (get<TypeFunctionSet>()) TypeFunctionSet(GetFunctionSetTypeName(*this, setTypeList), setTypeList);

	functionSetTypes.push_back(result);

	// This type is not added to export list

	return result;
}